

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::MapNativeTableField
          (RustGenerator *this,FieldDef *field,string *expr)

{
  CodeWriter *pCVar1;
  string *this_00;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (field->presence == kOptional) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"  let {{FIELD}} = self.{{FIELD}}.as_ref().map(|x|{",&local_f9);
    pCVar1 = &this->code_;
    CodeWriter::operator+=(pCVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::operator+(&local_38,"    ",expr);
    CodeWriter::operator+=(pCVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"  });",&local_f9);
    CodeWriter::operator+=(pCVar1,&local_98);
    this_00 = &local_98;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"  let {{FIELD}} = Some({",&local_f9);
    pCVar1 = &this->code_;
    CodeWriter::operator+=(pCVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"    let x = &self.{{FIELD}};",&local_f9);
    CodeWriter::operator+=(pCVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::operator+(&local_58,"    ",expr);
    CodeWriter::operator+=(pCVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"  });",&local_f9);
    CodeWriter::operator+=(pCVar1,&local_f8);
    this_00 = &local_f8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void MapNativeTableField(const FieldDef &field, const std::string &expr) {
    if (field.IsOptional()) {
      code_ += "  let {{FIELD}} = self.{{FIELD}}.as_ref().map(|x|{";
      code_ += "    " + expr;
      code_ += "  });";
    } else {
      // For some reason Args has optional types for required fields.
      // TODO(cneo): Fix this... but its a breaking change?
      code_ += "  let {{FIELD}} = Some({";
      code_ += "    let x = &self.{{FIELD}};";
      code_ += "    " + expr;
      code_ += "  });";
    }
  }